

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                  *this,dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  size_type sVar2;
  type_conflict1 tVar3;
  float fVar4;
  bool bVar5;
  bool bVar6;
  undefined1 uVar7;
  uint uVar8;
  bool bVar9;
  sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4> *this_00;
  size_type in_RDX;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_RDI;
  size_type in_stack_00000010;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_00000018;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_00000020;
  ValInfo *in_stack_ffffffffffffffa8;
  sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
  *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffe0;
  
  sVar1 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar2 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          shrink_threshold_;
  fVar4 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          shrink_factor_;
  bVar9 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          consider_shrink_;
  bVar5 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          use_empty_;
  bVar6 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          use_deleted_;
  uVar7 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          field_0x1b;
  uVar8 = (in_RSI->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          num_ht_copies_;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  enlarge_factor_ =
       (in_RSI->settings).
       super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
       enlarge_factor_;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  shrink_factor_ = fVar4;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  consider_shrink_ = bVar9;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.use_empty_
       = bVar5;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  use_deleted_ = bVar6;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.field_0x1b
       = uVar7;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  num_ht_copies_ = uVar8;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  enlarge_threshold_ = sVar1;
  (in_RDI->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  shrink_threshold_ = sVar2;
  tVar3 = (in_RSI->key_info).empty_key;
  (in_RDI->key_info).delkey = (in_RSI->key_info).delkey;
  (in_RDI->key_info).empty_key = tVar3;
  in_RDI->num_deleted = 0;
  in_RDI->num_elements = 0;
  in_RDI->num_buckets = 0;
  ValInfo::ValInfo((ValInfo *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI->table = (pointer)0x0;
  bVar9 = sparsehash_internal::
          sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
          use_empty((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                     *)in_RSI);
  if (bVar9) {
    bucket_count(in_RDI);
    sparsehash_internal::
    sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
    reset_thresholds(in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>>
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  else {
    size(in_RSI);
    this_00 = (sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4> *)
              sparsehash_internal::
              sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
              min_buckets((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                           *)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    in_RDI->num_buckets = (size_type)this_00;
    bucket_count(in_RDI);
    sparsehash_internal::
    sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
    reset_thresholds(this_00,(size_type)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }